

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adl_lsp_server.h
# Opt level: O0

void lscpp::experimental::launch<my_lsp_server::server>(server *server,transporter *transporter_)

{
  void *__stat_loc;
  undefined1 local_28 [8];
  future<void> rcv;
  transporter *transporter__local;
  server *server_local;
  
  __stat_loc = (void *)0x1;
  rcv.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)transporter_;
  std::
  async<lscpp::experimental::launch<my_lsp_server::server>(my_lsp_server::server&&,lscpp::transporter&&)::_lambda()_1_>
            ((launch)(__basic_future<void> *)local_28,(type *)0x1);
  std::__basic_future<void>::wait((__basic_future<void> *)local_28,__stat_loc);
  std::future<void>::~future((future<void> *)local_28);
  return;
}

Assistant:

void launch(Server &&server, transporter &&transporter_) {

  // Allows to attach a debugger,
  // before the language server starts to communicate with the client.
  //   std::this_thread::sleep_for(std::chrono::seconds(config.startup_delay));

  auto rcv = std::async(std::launch::async, [&]() {
    while (true) {
      auto header = parse_header(transporter_);

      if (header.content_length <
          0) { // TODO parse header should not use -1 to report an error
        continue;
      }
      auto msg = transporter_.read_message(header.content_length);

      auto result = lscpp_handle_message(server, msg);
      if (result) {
        write_lsp_message(transporter_, *result);
      }
    }
  });

  rcv.wait();
}